

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

Offset<reflection::Service>
reflection::CreateService
          (FlatBufferBuilder *_fbb,Offset<flatbuffers::String> name,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int>_> calls
          ,Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
           attributes,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          documentation,Offset<flatbuffers::String> declaration_file)

{
  Offset<reflection::Service> OVar1;
  ServiceBuilder builder_;
  ServiceBuilder local_40;
  
  local_40.fbb_ = _fbb;
  local_40.start_ = flatbuffers::FlatBufferBuilderImpl<false>::StartTable(_fbb);
  ServiceBuilder::add_declaration_file(&local_40,declaration_file);
  ServiceBuilder::add_documentation(&local_40,documentation);
  ServiceBuilder::add_attributes(&local_40,attributes);
  ServiceBuilder::add_calls(&local_40,calls);
  ServiceBuilder::add_name(&local_40,name);
  OVar1 = ServiceBuilder::Finish(&local_40);
  return (Offset<reflection::Service>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Service> CreateService(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::RPCCall>>> calls = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::KeyValue>>> attributes = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> documentation = 0,
    ::flatbuffers::Offset<::flatbuffers::String> declaration_file = 0) {
  ServiceBuilder builder_(_fbb);
  builder_.add_declaration_file(declaration_file);
  builder_.add_documentation(documentation);
  builder_.add_attributes(attributes);
  builder_.add_calls(calls);
  builder_.add_name(name);
  return builder_.Finish();
}